

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_22::UnknownFieldHandlerLite::Varint
               (MessageLite *msg,ParseTable *table,int tag,int value)

{
  LogMessage *other;
  string *target;
  StringOutputStream unknown_fields_string;
  CodedOutputStream unknown_fields_stream;
  
  if (table->unknown_field_set == true) {
    LogMessage::LogMessage
              ((LogMessage *)&unknown_fields_stream,LOGLEVEL_DFATAL,
               "third_party/protobuf-lite/generated_message_table_driven_lite.cc",0x45);
    other = LogMessage::operator<<
                      ((LogMessage *)&unknown_fields_stream,
                       "CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)&unknown_fields_string,other);
    LogMessage::~LogMessage((LogMessage *)&unknown_fields_stream);
  }
  target = (anonymous_namespace)::MutableUnknownFields_abi_cxx11_(msg,table->arena_offset);
  io::StringOutputStream::StringOutputStream(&unknown_fields_string,target);
  io::CodedOutputStream::CodedOutputStream
            (&unknown_fields_stream,&unknown_fields_string.super_ZeroCopyOutputStream,false);
  io::CodedOutputStream::WriteVarint32(&unknown_fields_stream,tag);
  io::CodedOutputStream::WriteVarint32(&unknown_fields_stream,value);
  io::CodedOutputStream::~CodedOutputStream(&unknown_fields_stream);
  return;
}

Assistant:

static void Varint(MessageLite* msg, const ParseTable& table, int tag,
                     int value) {
    GOOGLE_DCHECK(!table.unknown_field_set);

    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);
    unknown_fields_stream.WriteVarint32(tag);
    unknown_fields_stream.WriteVarint32(value);
  }